

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void __thiscall
duckdb::ART::VerifyAppend
          (ART *this,DataChunk *chunk,IndexAppendInfo *info,
          optional_ptr<duckdb::ConflictManager,_true> manager)

{
  ConflictManager local_manager;
  optional_ptr<duckdb::ConflictManager,_true> local_138;
  ConflictManager local_130;
  
  local_138.ptr = manager.ptr;
  if (manager.ptr == (ConflictManager *)0x0) {
    ConflictManager::ConflictManager
              (&local_130,APPEND,chunk->count,(optional_ptr<duckdb::ConflictInfo,_true>)0x0);
    (*(this->super_BoundIndex).super_Index._vptr_Index[10])(this,chunk,info,&local_130);
    ConflictManager::~ConflictManager(&local_130);
  }
  else {
    optional_ptr<duckdb::ConflictManager,_true>::CheckValid(&local_138);
    (*(this->super_BoundIndex).super_Index._vptr_Index[10])(this,chunk,info,local_138.ptr);
  }
  return;
}

Assistant:

void ART::VerifyAppend(DataChunk &chunk, IndexAppendInfo &info, optional_ptr<ConflictManager> manager) {
	if (manager) {
		D_ASSERT(manager->LookupType() == VerifyExistenceType::APPEND);
		return VerifyConstraint(chunk, info, *manager);
	}
	ConflictManager local_manager(VerifyExistenceType::APPEND, chunk.size());
	VerifyConstraint(chunk, info, local_manager);
}